

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::ColumnArrowToDuckDBRunEndEncoded
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  ArrowRunEndEncodingState *run_end_encoding;
  PhysicalType PVar1;
  ArrowArray *array_00;
  ArrowArray *array_01;
  ArrowScanLocalState *scan_state;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  SelectionVector *pSVar5;
  byte bVar6;
  unsigned_long uVar7;
  ArrowStructInfo *this;
  ArrowType *this_00;
  ArrowType *this_01;
  VectorBuffer *pVVar8;
  type pVVar9;
  long lVar10;
  data_ptr_t scan_offset;
  type pVVar11;
  ulong uVar12;
  NotImplementedException *pNVar13;
  ulong uVar14;
  PhysicalType type;
  PhysicalType type_00;
  ulong uVar15;
  ulong uVar16;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *puVar17;
  ulong uVar18;
  idx_t iVar19;
  data_ptr_t pdVar20;
  bool bVar21;
  ulong local_158;
  ulong local_148;
  UnifiedVectorFormat local_120;
  UnifiedVectorFormat run_end_format;
  unsigned_long compressed_size;
  data_ptr_t local_88;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  string local_50;
  
  array_00 = *array->children;
  array_01 = array->children[1];
  this = ArrowType::GetTypeInfo<duckdb::ArrowStructInfo>(arrow_type);
  this_00 = ArrowStructInfo::GetChild(this,0);
  this_01 = ArrowStructInfo::GetChild(this,1);
  scan_state = array_state->state;
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&run_end_format,
             (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&vector->buffer);
  lVar10 = CONCAT62(run_end_format.sel._2_6_,
                    CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&run_end_format.data);
  if (lVar10 != 0) {
    ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&run_end_format,
               (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&vector->buffer);
    pVVar8 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)&run_end_format);
    make_uniq<duckdb::ArrowAuxiliaryData,duckdb::shared_ptr<duckdb::ArrowArrayWrapper,true>&>
              ((duckdb *)&local_120,&array_state->owned_data);
    pSVar5 = local_120.sel;
    local_120.sel = (SelectionVector *)0x0;
    _Var2._M_head_impl =
         (pVVar8->aux_data).
         super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
    (pVVar8->aux_data).
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
         (VectorAuxiliaryData *)pSVar5;
    if ((_Var2._M_head_impl != (VectorAuxiliaryData *)0x0) &&
       ((**(code **)((long)(_Var2._M_head_impl)->_vptr_VectorAuxiliaryData + 8))(),
       (pointer)local_120.sel != (pointer)0x0)) {
      (**(_func_int **)((long)(local_120.sel)->sel_vector + 8))();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&run_end_format.data);
  }
  compressed_size = NumericCastImpl<unsigned_long,_long,_false>::Convert(array_00->length);
  run_end_encoding = &array_state->run_end_encoding;
  if ((Vector *)
      (array_state->run_end_encoding).run_ends.
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false> == (Vector *)0x0) {
    local_88 = (data_ptr_t)nested_offset;
    ArrowType::GetDuckType((LogicalType *)&run_end_format,this_00,false);
    make_uniq<duckdb::Vector,duckdb::LogicalType,unsigned_long&>
              ((duckdb *)&local_120,(LogicalType *)&run_end_format,&compressed_size);
    pSVar5 = local_120.sel;
    local_120.sel = (SelectionVector *)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
               run_end_encoding,(pointer)pSVar5);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_120);
    LogicalType::~LogicalType((LogicalType *)&run_end_format);
    ArrowType::GetDuckType((LogicalType *)&run_end_format,this_01,false);
    make_uniq<duckdb::Vector,duckdb::LogicalType,unsigned_long&>
              ((duckdb *)&local_120,(LogicalType *)&run_end_format,&compressed_size);
    pSVar5 = local_120.sel;
    puVar17 = &(array_state->run_end_encoding).values;
    local_120.sel = (SelectionVector *)0x0;
    ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
              ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)puVar17,
               (pointer)pSVar5);
    ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
              ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_120);
    LogicalType::~LogicalType((LogicalType *)&run_end_format);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    ColumnArrowToDuckDB(pVVar9,array_00,array_state,compressed_size,this_00,-1,(ValidityMask *)0x0,0
                        ,false);
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (puVar17);
    uVar7 = compressed_size;
    lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
    nested_offset = (int64_t)local_88;
    SetValidityMask(pVVar9,array_01,scan_state,uVar7,lVar10,(int64_t)local_88,false);
    ColumnArrowToDuckDB(pVVar9,array_01,array_state,compressed_size,this_01,-1,(ValidityMask *)0x0,0
                        ,false);
  }
  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)parent_mask);
  scan_offset = (data_ptr_t)(lVar10 + array->offset + scan_state->chunk_offset);
  if ((data_ptr_t)nested_offset != (data_ptr_t)0xffffffffffffffff) {
    scan_offset = (data_ptr_t)(nested_offset + array->offset);
  }
  ArrowType::GetDuckType((LogicalType *)&run_end_format,this_00,false);
  bVar6 = run_end_format.sel._1_1_;
  LogicalType::~LogicalType((LogicalType *)&run_end_format);
  uVar7 = compressed_size;
  if ((bVar6 == 9) || (bVar6 == 7)) {
    FlattenRunEndsSwitch<int>(vector,run_end_encoding,compressed_size,(idx_t)scan_offset,size);
  }
  else {
    if (bVar6 != 5) {
      pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&run_end_format,"Type \'%s\' not implemented for RunEndEncoding",
                 (allocator *)&local_120);
      TypeIdToString_abi_cxx11_(&local_70,(duckdb *)(ulong)bVar6,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (pNVar13,(string *)&run_end_format,&local_70);
      __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar17 = &(array_state->run_end_encoding).values;
    pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (puVar17);
    PVar1 = (pVVar9->type).physical_type_;
    switch(PVar1) {
    case BOOL:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            pdVar3[uVar16 + uVar15] = local_120.data[uVar14];
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              pdVar3[iVar19] = local_120.data[uVar16];
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case UINT8:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            pdVar3[uVar16 + uVar15] = local_120.data[uVar14];
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              pdVar3[iVar19] = local_120.data[uVar16];
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case INT8:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            pdVar3[uVar16 + uVar15] = local_120.data[uVar14];
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              pdVar3[iVar19] = local_120.data[uVar16];
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case UINT16:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined2 *)(pdVar3 + uVar16 * 2 + uVar15 * 2) =
                 *(undefined2 *)(local_120.data + uVar14 * 2);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined2 *)(pdVar3 + iVar19 * 2) = *(undefined2 *)(local_120.data + uVar16 * 2);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case INT16:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined2 *)(pdVar3 + uVar16 * 2 + uVar15 * 2) =
                 *(undefined2 *)(local_120.data + uVar14 * 2);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined2 *)(pdVar3 + iVar19 * 2) = *(undefined2 *)(local_120.data + uVar16 * 2);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case UINT32:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined4 *)(pdVar3 + uVar16 * 4 + uVar15 * 4) =
                 *(undefined4 *)(local_120.data + uVar14 * 4);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined4 *)(pdVar3 + iVar19 * 4) = *(undefined4 *)(local_120.data + uVar16 * 4);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case INT32:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined4 *)(pdVar3 + uVar16 * 4 + uVar15 * 4) =
                 *(undefined4 *)(local_120.data + uVar14 * 4);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined4 *)(pdVar3 + iVar19 * 4) = *(undefined4 *)(local_120.data + uVar16 * 4);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case UINT64:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined8 *)(pdVar3 + uVar16 * 8 + uVar15 * 8) =
                 *(undefined8 *)(local_120.data + uVar14 * 8);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined8 *)(pdVar3 + iVar19 * 8) = *(undefined8 *)(local_120.data + uVar16 * 8);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case INT64:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined8 *)(pdVar3 + uVar16 * 8 + uVar15 * 8) =
                 *(undefined8 *)(local_120.data + uVar14 * 8);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined8 *)(pdVar3 + iVar19 * 8) = *(undefined8 *)(local_120.data + uVar16 * 8);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
switchD_018a5e60_caseD_a:
      pNVar13 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&run_end_format,"RunEndEncoded value type \'%s\' not supported yet",
                 (allocator *)&local_120);
      TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)PVar1,type_00);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (pNVar13,(string *)&run_end_format,&local_50);
      __cxa_throw(pNVar13,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined4 *)(pdVar3 + uVar16 * 4 + uVar15 * 4) =
                 *(undefined4 *)(local_120.data + uVar14 * 4);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined4 *)(pdVar3 + iVar19 * 4) = *(undefined4 *)(local_120.data + uVar16 * 4);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case DOUBLE:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined8 *)(pdVar3 + uVar16 * 8 + uVar15 * 8) =
                 *(undefined8 *)(local_120.data + uVar14 * 8);
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_158 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_158;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158)) < size - local_158) {
            uVar14 = (long)*(short *)(run_end_format.data + uVar15 * 2) -
                     (long)(scan_offset + local_158);
          }
          iVar19 = local_158;
          uVar15 = local_158;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            while (uVar18 != 0) {
              *(undefined8 *)(pdVar3 + iVar19 * 8) = *(undefined8 *)(local_120.data + uVar16 * 8);
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,iVar19);
              iVar19 = iVar19 + 1;
              uVar18 = uVar18 - 1;
            }
          }
          local_158 = local_158 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_158 < size);
      }
      break;
    case INTERVAL:
      pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (puVar17);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
      Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
      Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
      pdVar3 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
      if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar15 = 0;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar16 = uVar12;
          if (lVar10 != 0) {
            uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar14 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar18 = size - uVar15;
          if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15)) < size - uVar15) {
            uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                     (long)(scan_offset + uVar15);
          }
          pdVar20 = pdVar3 + uVar15 * 0x10;
          uVar16 = uVar18;
          while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
            uVar4 = *(undefined8 *)(local_120.data + uVar14 * 0x10 + 8);
            *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar14 * 0x10);
            *(undefined8 *)(pdVar20 + 8) = uVar4;
            pdVar20 = pdVar20 + 0x10;
          }
          uVar15 = uVar15 + uVar18;
          uVar12 = uVar12 + 1;
        } while (uVar15 < size);
      }
      else {
        local_148 = 0;
        local_88 = run_end_format.data;
        do {
          if (uVar7 <= uVar12) break;
          lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                     CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
          uVar15 = uVar12;
          if (lVar10 != 0) {
            uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
          }
          uVar16 = uVar12;
          if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
            uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
          }
          uVar14 = size - local_148;
          if ((ulong)((long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148)) <
              size - local_148) {
            uVar14 = (long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148);
          }
          uVar15 = local_148;
          uVar18 = uVar14;
          if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
              uVar15 = uVar15 + 1;
            }
          }
          else {
            pdVar20 = pdVar3 + local_148 * 0x10;
            uVar15 = uVar14;
            uVar18 = local_148;
            while (bVar21 = uVar15 != 0, uVar15 = uVar15 - 1, bVar21) {
              uVar4 = *(undefined8 *)(local_120.data + uVar16 * 0x10 + 8);
              *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar16 * 0x10);
              *(undefined8 *)(pdVar20 + 8) = uVar4;
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar18);
              uVar18 = uVar18 + 1;
              pdVar20 = pdVar20 + 0x10;
            }
          }
          local_148 = local_148 + uVar14;
          uVar12 = uVar12 + 1;
        } while (local_148 < size);
      }
      break;
    default:
      if (PVar1 == VARCHAR) {
        ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                   &pVVar9->auxiliary);
        shared_ptr<duckdb::VectorBuffer,_true>::operator=
                  (&vector->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_80);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (&run_end_encoding->run_ends);
        pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (puVar17);
        UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
        Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
        Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
        pdVar3 = vector->data;
        FlatVector::VerifyFlatVector(vector);
        uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
        if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar15 = 0;
          do {
            if (uVar7 <= uVar12) break;
            lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                       CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
            uVar16 = uVar12;
            if (lVar10 != 0) {
              uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
            }
            uVar14 = uVar12;
            if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
              uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
            }
            uVar18 = size - uVar15;
            if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                       (long)(scan_offset + uVar15)) < size - uVar15) {
              uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                       (long)(scan_offset + uVar15);
            }
            pdVar20 = pdVar3 + uVar15 * 0x10;
            uVar16 = uVar18;
            while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
              uVar4 = *(undefined8 *)(local_120.data + uVar14 * 0x10 + 8);
              *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar14 * 0x10);
              *(undefined8 *)(pdVar20 + 8) = uVar4;
              pdVar20 = pdVar20 + 0x10;
            }
            uVar15 = uVar15 + uVar18;
            uVar12 = uVar12 + 1;
          } while (uVar15 < size);
        }
        else {
          local_148 = 0;
          local_88 = run_end_format.data;
          do {
            if (uVar7 <= uVar12) break;
            lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                       CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
            uVar15 = uVar12;
            if (lVar10 != 0) {
              uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
            }
            uVar16 = uVar12;
            if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
              uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
            }
            uVar14 = size - local_148;
            if ((ulong)((long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148)) <
                size - local_148) {
              uVar14 = (long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148);
            }
            uVar15 = local_148;
            uVar18 = uVar14;
            if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
              while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
                uVar15 = uVar15 + 1;
              }
            }
            else {
              pdVar20 = pdVar3 + local_148 * 0x10;
              uVar15 = uVar14;
              uVar18 = local_148;
              while (bVar21 = uVar15 != 0, uVar15 = uVar15 - 1, bVar21) {
                uVar4 = *(undefined8 *)(local_120.data + uVar16 * 0x10 + 8);
                *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar16 * 0x10);
                *(undefined8 *)(pdVar20 + 8) = uVar4;
                TemplatedValidityMask<unsigned_long>::SetValid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar18);
                uVar18 = uVar18 + 1;
                pdVar20 = pdVar20 + 0x10;
              }
            }
            local_148 = local_148 + uVar14;
            uVar12 = uVar12 + 1;
          } while (local_148 < size);
        }
      }
      else {
        if (PVar1 != INT128) goto switchD_018a5e60_caseD_a;
        pVVar9 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (&run_end_encoding->run_ends);
        pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (puVar17);
        UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_120);
        Vector::ToUnifiedFormat(pVVar9,uVar7,&run_end_format);
        Vector::ToUnifiedFormat(pVVar11,uVar7,&local_120);
        pdVar3 = vector->data;
        FlatVector::VerifyFlatVector(vector);
        uVar12 = FindRunIndex<short>((short *)run_end_format.data,uVar7,(idx_t)scan_offset);
        if (local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar15 = 0;
          do {
            if (uVar7 <= uVar12) break;
            lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                       CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
            uVar16 = uVar12;
            if (lVar10 != 0) {
              uVar16 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
            }
            uVar14 = uVar12;
            if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
              uVar14 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
            }
            uVar18 = size - uVar15;
            if ((ulong)((long)*(short *)(run_end_format.data + uVar16 * 2) -
                       (long)(scan_offset + uVar15)) < size - uVar15) {
              uVar18 = (long)*(short *)(run_end_format.data + uVar16 * 2) -
                       (long)(scan_offset + uVar15);
            }
            pdVar20 = pdVar3 + uVar15 * 0x10;
            uVar16 = uVar18;
            while (bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
              uVar4 = *(undefined8 *)(local_120.data + uVar14 * 0x10 + 8);
              *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar14 * 0x10);
              *(undefined8 *)(pdVar20 + 8) = uVar4;
              pdVar20 = pdVar20 + 0x10;
            }
            uVar15 = uVar15 + uVar18;
            uVar12 = uVar12 + 1;
          } while (uVar15 < size);
        }
        else {
          local_148 = 0;
          local_88 = run_end_format.data;
          do {
            if (uVar7 <= uVar12) break;
            lVar10 = *(long *)CONCAT62(run_end_format.sel._2_6_,
                                       CONCAT11(run_end_format.sel._1_1_,run_end_format.sel._0_1_));
            uVar15 = uVar12;
            if (lVar10 != 0) {
              uVar15 = (ulong)*(uint *)(lVar10 + uVar12 * 4);
            }
            uVar16 = uVar12;
            if ((_func_int **)(local_120.sel)->sel_vector != (_func_int **)0x0) {
              uVar16 = (ulong)*(uint *)((long)(local_120.sel)->sel_vector + uVar12 * 4);
            }
            uVar14 = size - local_148;
            if ((ulong)((long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148)) <
                size - local_148) {
              uVar14 = (long)*(short *)(local_88 + uVar15 * 2) - (long)(scan_offset + local_148);
            }
            uVar15 = local_148;
            uVar18 = uVar14;
            if ((local_120.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
              while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar15);
                uVar15 = uVar15 + 1;
              }
            }
            else {
              pdVar20 = pdVar3 + local_148 * 0x10;
              uVar15 = uVar14;
              uVar18 = local_148;
              while (bVar21 = uVar15 != 0, uVar15 = uVar15 - 1, bVar21) {
                uVar4 = *(undefined8 *)(local_120.data + uVar16 * 0x10 + 8);
                *(undefined8 *)pdVar20 = *(undefined8 *)(local_120.data + uVar16 * 0x10);
                *(undefined8 *)(pdVar20 + 8) = uVar4;
                TemplatedValidityMask<unsigned_long>::SetValid
                          (&(vector->validity).super_TemplatedValidityMask<unsigned_long>,uVar18);
                uVar18 = uVar18 + 1;
                pdVar20 = pdVar20 + 0x10;
              }
            }
            local_148 = local_148 + uVar14;
            uVar12 = uVar12 + 1;
          } while (local_148 < size);
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_120);
    UnifiedVectorFormat::~UnifiedVectorFormat(&run_end_format);
  }
  return;
}

Assistant:

static void ColumnArrowToDuckDBRunEndEncoded(Vector &vector, const ArrowArray &array, ArrowArrayScanState &array_state,
                                             idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                             ValidityMask *parent_mask, uint64_t parent_offset) {
	// Scan the 'run_ends' array
	D_ASSERT(array.n_children == 2);
	auto &run_ends_array = *array.children[0];
	auto &values_array = *array.children[1];

	auto &struct_info = arrow_type.GetTypeInfo<ArrowStructInfo>();
	auto &run_ends_type = struct_info.GetChild(0);
	auto &values_type = struct_info.GetChild(1);
	D_ASSERT(vector.GetType() == values_type.GetDuckType());

	auto &scan_state = array_state.state;
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}

	D_ASSERT(run_ends_array.length == values_array.length);
	auto compressed_size = NumericCast<idx_t>(run_ends_array.length);
	// Create a vector for the run ends and the values
	auto &run_end_encoding = array_state.RunEndEncoding();
	if (!run_end_encoding.run_ends) {
		// The run ends and values have not been scanned yet for this array
		D_ASSERT(!run_end_encoding.values);
		run_end_encoding.run_ends = make_uniq<Vector>(run_ends_type.GetDuckType(), compressed_size);
		run_end_encoding.values = make_uniq<Vector>(values_type.GetDuckType(), compressed_size);

		ColumnArrowToDuckDB(*run_end_encoding.run_ends, run_ends_array, array_state, compressed_size, run_ends_type);
		auto &values = *run_end_encoding.values;
		SetValidityMask(values, values_array, scan_state, compressed_size, NumericCast<int64_t>(parent_offset),
		                nested_offset);
		ColumnArrowToDuckDB(values, values_array, array_state, compressed_size, values_type);
	}

	idx_t scan_offset = GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);
	auto physical_type = run_ends_type.GetDuckType().InternalType();
	switch (physical_type) {
	case PhysicalType::INT16:
		FlattenRunEndsSwitch<int16_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEndsSwitch<int32_t>(vector, run_end_encoding, compressed_size, scan_offset, size);
		break;
	default:
		throw NotImplementedException("Type '%s' not implemented for RunEndEncoding", TypeIdToString(physical_type));
	}
}